

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  bool bVar1;
  CppType CVar2;
  uint uVar3;
  Type TVar4;
  LogMessage *pLVar5;
  FastFieldValuePrinter *pFVar6;
  Message *message_00;
  uint64_t uVar7;
  int64_t iVar8;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar9;
  AlphaNum *a;
  long lStack_e0;
  string scratch;
  LogMessage local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string truncated_value;
  
  if ((index != -1) && (((byte)field[1] & 0x60) != 0x60)) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x9cd);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_a8,"CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)&scratch,pLVar5);
    internal::LogMessage::~LogMessage(&local_a8);
  }
  pFVar6 = GetFieldPrinter(this,field);
  CVar2 = FieldDescriptor::cpp_type(field);
  switch(CVar2) {
  case CPPTYPE_INT32:
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar3 = Reflection::GetRepeatedInt32(reflection,message,field,index);
    }
    else {
      uVar3 = Reflection::GetInt32(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[3])(pFVar6,(ulong)uVar3,generator);
    break;
  case CPPTYPE_INT64:
    if ((~(byte)field[1] & 0x60) == 0) {
      iVar8 = Reflection::GetRepeatedInt64(reflection,message,field,index);
    }
    else {
      iVar8 = Reflection::GetInt64(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[5])(pFVar6,iVar8,generator);
    break;
  case CPPTYPE_UINT32:
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar3 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
    }
    else {
      uVar3 = Reflection::GetUInt32(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[4])(pFVar6,(ulong)uVar3,generator);
    break;
  case CPPTYPE_UINT64:
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar7 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
    }
    else {
      uVar7 = Reflection::GetUInt64(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[6])(pFVar6,uVar7,generator);
    break;
  case CPPTYPE_DOUBLE:
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::GetRepeatedDouble(reflection,message,field,index);
    }
    else {
      Reflection::GetDouble(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[8])(pFVar6,generator);
    break;
  case CPPTYPE_FLOAT:
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::GetRepeatedFloat(reflection,message,field,index);
    }
    else {
      Reflection::GetFloat(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[7])(pFVar6,generator);
    break;
  case CPPTYPE_BOOL:
    if ((~(byte)field[1] & 0x60) == 0) {
      bVar1 = Reflection::GetRepeatedBool(reflection,message,field,index);
    }
    else {
      bVar1 = Reflection::GetBool(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[2])(pFVar6,(ulong)bVar1,generator);
    break;
  case CPPTYPE_ENUM:
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar3 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
    }
    else {
      uVar3 = Reflection::GetEnumValue(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar9 = EnumDescriptor::FindValueByNumber(this_01,uVar3);
    if (pEVar9 != (EnumValueDescriptor *)0x0) {
      (*pFVar6->_vptr_FastFieldValuePrinter[0xb])
                (pFVar6,(ulong)uVar3,*(undefined8 *)(pEVar9 + 8),generator);
      return;
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_a8,uVar3);
    StrCat_abi_cxx11_(&scratch,(protobuf *)&local_a8,a);
    (*pFVar6->_vptr_FastFieldValuePrinter[0xb])(pFVar6,(ulong)uVar3,&scratch,generator);
    goto LAB_003ad964;
  case CPPTYPE_STRING:
    scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
    scratch._M_string_length = 0;
    scratch.field_2._M_local_buf[0] = '\0';
    if ((~(byte)field[1] & 0x60) == 0) {
      this_00 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&scratch);
    }
    else {
      this_00 = Reflection::GetStringReference(reflection,message,field,&scratch);
    }
    truncated_value._M_dataplus._M_p = (pointer)&truncated_value.field_2;
    truncated_value._M_string_length = 0;
    truncated_value.field_2._M_local_buf[0] = '\0';
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                     &local_70,"...<truncated>...");
      this_00 = &truncated_value;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_70);
    }
    TVar4 = FieldDescriptor::type(field);
    if (TVar4 == TYPE_STRING) {
      lStack_e0 = 0x48;
    }
    else {
      TVar4 = FieldDescriptor::type(field);
      if (TVar4 != TYPE_BYTES) {
        internal::LogMessage::LogMessage
                  (&local_a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x9f8);
        pLVar5 = internal::LogMessage::operator<<
                           (&local_a8,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar5);
        internal::LogMessage::~LogMessage(&local_a8);
      }
      lStack_e0 = 0x50;
    }
    (**(code **)((long)pFVar6->_vptr_FastFieldValuePrinter + lStack_e0))(pFVar6,this_00,generator);
    std::__cxx11::string::~string((string *)&truncated_value);
LAB_003ad964:
    std::__cxx11::string::~string((string *)&scratch);
    break;
  case CPPTYPE_MESSAGE:
    if ((~(byte)field[1] & 0x60) == 0) {
      message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
    }
    else {
      message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
    }
    Print(this,message_00,generator);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          static_cast<size_t>(truncate_string_field_longer_than_) <
              value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}